

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmscreen.cpp
# Opt level: O0

void __thiscall QEglFSKmsGbmScreen::flip(QEglFSKmsGbmScreen *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  gbm_bo *pgVar5;
  FrameBuffer *pFVar6;
  QKmsOutput *pQVar7;
  QKmsDevice *pQVar8;
  iterator o;
  drmModeAtomicReq *pdVar9;
  char *pcVar10;
  QEglFSKmsGbmScreen *in_RDI;
  long in_FS_OFFSET;
  int ret_1;
  drmModeAtomicReq *request_1;
  QKmsOutput *destOutput;
  CloneDestination *d;
  QList<QEglFSKmsGbmScreen::CloneDestination> *__range1;
  int ret;
  drmModeAtomicReq *request;
  int fd;
  QKmsOutput *thisOutput;
  FrameBuffer *fb;
  iterator __end1;
  iterator __begin1;
  QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_plugins_platforms_eglfs_deviceintegration_eglfs_kms_qeglfskmsgbmscreen_cpp:383:35)>
  gbmRelease;
  anon_class_8_1_8991fb9c_for_m_func *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  QMessageLogger *in_stack_fffffffffffffe00;
  QKmsOutput *in_stack_fffffffffffffe08;
  QKmsDevice *in_stack_fffffffffffffe10;
  uint32_t in_stack_fffffffffffffe24;
  QKmsOutput *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  QEglFSKmsGbmScreen *pQVar11;
  QEglFSKmsGbmScreen *in_stack_fffffffffffffe58;
  undefined1 local_178 [8];
  gbm_bo *in_stack_fffffffffffffe90;
  QEglFSKmsGbmScreen *in_stack_fffffffffffffe98;
  iterator local_138;
  QString local_130 [2];
  char local_100 [40];
  QString local_d8 [2];
  char local_a8 [32];
  char local_88 [32];
  QString local_68 [2];
  char local_38 [32];
  QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_plugins_platforms_eglfs_deviceintegration_eglfs_kms_qeglfskmsgbmscreen_cpp:383:35)>
  local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI->field_0x228 & 1) != 0) goto LAB_0011ce12;
  iVar2 = (int)((ulong)in_RDI >> 0x20);
  if (in_RDI->m_cloneSource != (QEglFSKmsGbmScreen *)0x0) {
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffe00,
               (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),iVar2,
               (char *)in_stack_fffffffffffffde8);
    (**(code **)(*(long *)&in_RDI->super_QEglFSKmsScreen + 0x90))(local_68);
    QtPrivate::asString(local_68);
    QString::toLocal8Bit(&in_stack_fffffffffffffe08->name);
    pcVar4 = QByteArray::constData((QByteArray *)0x11c742);
    QMessageLogger::warning
              (local_38,"Screen %s clones another screen. swapBuffers() not allowed.",pcVar4);
    QByteArray::~QByteArray((QByteArray *)0x11c768);
    QString::~QString((QString *)0x11c775);
    goto LAB_0011ce12;
  }
  if (in_RDI->m_gbm_surface == (gbm_surface *)0x0) {
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffe00,
               (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),iVar2,
               (char *)in_stack_fffffffffffffde8);
    QMessageLogger::warning(local_88,"Cannot sync before platform init!");
    goto LAB_0011ce12;
  }
  pQVar11 = in_RDI;
  pgVar5 = (gbm_bo *)gbm_surface_lock_front_buffer(in_RDI->m_gbm_surface);
  in_RDI->m_gbm_bo_next = pgVar5;
  if (in_RDI->m_gbm_bo_next == (gbm_bo *)0x0) {
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffe00,
               (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
               (int)((ulong)in_RDI >> 0x20),(char *)in_stack_fffffffffffffde8);
    (**(code **)(*(long *)&in_RDI->super_QEglFSKmsScreen + 0x90))(local_d8);
    QtPrivate::asString(local_d8);
    QString::toLocal8Bit(&in_stack_fffffffffffffe08->name);
    pcVar4 = QByteArray::constData((QByteArray *)0x11c83e);
    QMessageLogger::warning(local_a8,"Could not lock GBM surface front buffer for screen %s",pcVar4)
    ;
    QByteArray::~QByteArray((QByteArray *)0x11c864);
    QString::~QString((QString *)0x11c871);
    goto LAB_0011ce12;
  }
  local_18.m_func.this = (QEglFSKmsGbmScreen *)0xaaaaaaaaaaaaaaaa;
  local_18.m_invoke = true;
  local_18._9_7_ = 0xaaaaaaaaaaaaaa;
  qScopeGuard<QEglFSKmsGbmScreen::flip()::__0>(in_stack_fffffffffffffde8);
  pFVar6 = framebufferForBufferObject(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  if (pFVar6 == (FrameBuffer *)0x0) {
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffe00,
               (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
               (int)((ulong)in_RDI >> 0x20),(char *)in_stack_fffffffffffffde8);
    QMessageLogger::warning(local_100,"FrameBuffer not available. Cannot flip");
  }
  else {
    ensureModeSet(in_stack_fffffffffffffe58,(uint32_t)((ulong)pQVar11 >> 0x20));
    pQVar7 = QEglFSKmsScreen::output(&in_RDI->super_QEglFSKmsScreen);
    pQVar8 = (QKmsDevice *)QEglFSKmsScreen::device(&in_RDI->super_QEglFSKmsScreen);
    iVar2 = QKmsDevice::fd(pQVar8);
    in_RDI->m_flipPending = true;
    pQVar8 = (QKmsDevice *)QEglFSKmsScreen::device(&in_RDI->super_QEglFSKmsScreen);
    bVar1 = QKmsDevice::hasAtomicSupport(pQVar8);
    if (bVar1) {
      QEglFSKmsScreen::device(&in_RDI->super_QEglFSKmsScreen);
      in_stack_fffffffffffffe28 =
           (QKmsOutput *)
           QKmsDevice::threadLocalAtomicRequest
                     ((QKmsDevice *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      if (in_stack_fffffffffffffe28 != (QKmsOutput *)0x0) {
        addAtomicFlip((drmModeAtomicReq *)CONCAT44(iVar2,in_stack_fffffffffffffe30),
                      in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
        if ((flip()::zpos == '\0') && (iVar3 = __cxa_guard_acquire(&flip()::zpos), iVar3 != 0)) {
          flip::zpos = qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_ZPOS",(bool *)0x0);
          __cxa_guard_release(&flip()::zpos);
        }
        if (flip::zpos != 0) {
          drmModeAtomicAddProperty
                    (in_stack_fffffffffffffe28,pQVar7->eglfs_plane->id,
                     pQVar7->eglfs_plane->zposPropertyId,(long)flip::zpos);
        }
        if ((flip()::blendOp == '\0') && (iVar3 = __cxa_guard_acquire(&flip()::blendOp), iVar3 != 0)
           ) {
          flip::blendOp = qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_BLEND_OP",(bool *)0x0);
          __cxa_guard_release(&flip()::blendOp);
        }
        if (flip::blendOp != 0) {
          drmModeAtomicAddProperty
                    (in_stack_fffffffffffffe28,pQVar7->eglfs_plane->id,
                     pQVar7->eglfs_plane->blendOpPropertyId,flip::blendOp);
        }
      }
    }
    else {
      iVar3 = drmModePageFlip(iVar2,pQVar7->crtc_id,pFVar6->fb,1,in_RDI);
      if (iVar3 != 0) {
        (**(code **)(*(long *)&in_RDI->super_QEglFSKmsScreen + 0x90))(local_130);
        QtPrivate::asString(local_130);
        QString::toLocal8Bit(&in_stack_fffffffffffffe08->name);
        pcVar4 = QByteArray::constData((QByteArray *)0x11cb08);
        qErrnoWarning("Could not queue DRM page flip on screen %s",pcVar4);
        QByteArray::~QByteArray((QByteArray *)0x11cb26);
        QString::~QString((QString *)0x11cb33);
        goto LAB_0011ce05;
      }
      in_stack_fffffffffffffe24 = 0;
    }
    local_138.i = (CloneDestination *)0xaaaaaaaaaaaaaaaa;
    local_138 = QList<QEglFSKmsGbmScreen::CloneDestination>::begin
                          ((QList<QEglFSKmsGbmScreen::CloneDestination> *)in_RDI);
    o = QList<QEglFSKmsGbmScreen::CloneDestination>::end
                  ((QList<QEglFSKmsGbmScreen::CloneDestination> *)in_RDI);
    while (bVar1 = QList<QEglFSKmsGbmScreen::CloneDestination>::iterator::operator!=(&local_138,o),
          bVar1) {
      in_stack_fffffffffffffe10 =
           (QKmsDevice *)
           QList<QEglFSKmsGbmScreen::CloneDestination>::iterator::operator*(&local_138);
      if ((QEglFSKmsGbmScreen *)in_stack_fffffffffffffe10->_vptr_QKmsDevice != in_RDI) {
        ensureModeSet(in_stack_fffffffffffffe58,(uint32_t)((ulong)pQVar11 >> 0x20));
        *(bool *)&in_stack_fffffffffffffe10->m_screenConfig = true;
        in_stack_fffffffffffffe08 =
             QEglFSKmsScreen::output((QEglFSKmsScreen *)in_stack_fffffffffffffe10->_vptr_QKmsDevice)
        ;
        pQVar8 = (QKmsDevice *)QEglFSKmsScreen::device(&in_RDI->super_QEglFSKmsScreen);
        bVar1 = QKmsDevice::hasAtomicSupport(pQVar8);
        if (bVar1) {
          QEglFSKmsScreen::device(&in_RDI->super_QEglFSKmsScreen);
          pdVar9 = QKmsDevice::threadLocalAtomicRequest
                             ((QKmsDevice *)
                              CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
          if (pdVar9 != (drmModeAtomicReq *)0x0) {
            addAtomicFlip((drmModeAtomicReq *)CONCAT44(iVar2,in_stack_fffffffffffffe30),
                          in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
          }
        }
        else {
          in_stack_fffffffffffffdfc =
               drmModePageFlip(iVar2,in_stack_fffffffffffffe08->crtc_id,pFVar6->fb,1,
                               (QEglFSKmsGbmScreen *)in_stack_fffffffffffffe10->_vptr_QKmsDevice);
          if (in_stack_fffffffffffffdfc != 0) {
            (**(code **)(*(long *)in_stack_fffffffffffffe10->_vptr_QKmsDevice + 0x90))(local_178);
            QtPrivate::asString((QString *)local_178);
            QString::toLocal8Bit(&in_stack_fffffffffffffe08->name);
            pcVar4 = QByteArray::constData((QByteArray *)0x11cd0c);
            (**(code **)(*(long *)&in_RDI->super_QEglFSKmsScreen + 0x90))(&stack0xfffffffffffffe58);
            QtPrivate::asString((QString *)&stack0xfffffffffffffe58);
            QString::toLocal8Bit(&in_stack_fffffffffffffe08->name);
            pcVar10 = QByteArray::constData((QByteArray *)0x11cd4a);
            qErrnoWarning("Could not queue DRM page flip for screen %s (clones screen %s)",pcVar4,
                          pcVar10);
            QByteArray::~QByteArray((QByteArray *)0x11cd6c);
            QString::~QString((QString *)0x11cd76);
            QByteArray::~QByteArray((QByteArray *)0x11cd83);
            QString::~QString((QString *)0x11cd90);
            *(bool *)&in_stack_fffffffffffffe10->m_screenConfig = false;
          }
        }
      }
      QList<QEglFSKmsGbmScreen::CloneDestination>::iterator::operator++(&local_138);
    }
    pQVar8 = (QKmsDevice *)QEglFSKmsScreen::device(&in_RDI->super_QEglFSKmsScreen);
    bVar1 = QKmsDevice::hasAtomicSupport(pQVar8);
    if (bVar1) {
      QEglFSKmsScreen::device(&in_RDI->super_QEglFSKmsScreen);
      bVar1 = QKmsDevice::threadLocalAtomicCommit
                        (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      if (!bVar1) goto LAB_0011ce05;
    }
    QScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/plugins/platforms/eglfs/deviceintegration/eglfs_kms/qeglfskmsgbmscreen.cpp:383:35)>
    ::dismiss(&local_18);
  }
LAB_0011ce05:
  QScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/plugins/platforms/eglfs/deviceintegration/eglfs_kms/qeglfskmsgbmscreen.cpp:383:35)>
  ::~QScopeGuard((QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_plugins_platforms_eglfs_deviceintegration_eglfs_kms_qeglfskmsgbmscreen_cpp:383:35)>
                  *)in_RDI);
LAB_0011ce12:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEglFSKmsGbmScreen::flip()
{
    // For headless screen just return silently. It is not necessarily an error
    // to end up here, so show no warnings.
    if (m_headless)
        return;

    if (m_cloneSource) {
        qWarning("Screen %s clones another screen. swapBuffers() not allowed.", qPrintable(name()));
        return;
    }

    if (!m_gbm_surface) {
        qWarning("Cannot sync before platform init!");
        return;
    }

    m_gbm_bo_next = gbm_surface_lock_front_buffer(m_gbm_surface);
    if (!m_gbm_bo_next) {
        qWarning("Could not lock GBM surface front buffer for screen %s", qPrintable(name()));
        return;
    }

    auto gbmRelease = qScopeGuard([this]{
        m_flipPending = false;
        gbm_surface_release_buffer(m_gbm_surface, m_gbm_bo_next);
        m_gbm_bo_next = nullptr;
    });

    FrameBuffer *fb = framebufferForBufferObject(m_gbm_bo_next);
    if (!fb) {
        qWarning("FrameBuffer not available. Cannot flip");
        return;
    }
    ensureModeSet(fb->fb);

    const QKmsOutput &thisOutput(output());
    const int fd = device()->fd();
    m_flipPending = true;

    if (device()->hasAtomicSupport()) {
#if QT_CONFIG(drm_atomic)
        drmModeAtomicReq *request = device()->threadLocalAtomicRequest();
        if (request) {
            addAtomicFlip(request, thisOutput, fb->fb);
            static int zpos = qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_ZPOS");
            if (zpos) {
                drmModeAtomicAddProperty(request, thisOutput.eglfs_plane->id,
                                         thisOutput.eglfs_plane->zposPropertyId, zpos);
            }
            static uint blendOp = uint(qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_BLEND_OP"));
            if (blendOp) {
                drmModeAtomicAddProperty(request, thisOutput.eglfs_plane->id,
                                         thisOutput.eglfs_plane->blendOpPropertyId, blendOp);
            }
        }
#endif
    } else {
        int ret = drmModePageFlip(fd,
                                  thisOutput.crtc_id,
                                  fb->fb,
                                  DRM_MODE_PAGE_FLIP_EVENT,
                                  this);
        if (ret) {
            qErrnoWarning("Could not queue DRM page flip on screen %s", qPrintable(name()));
            return;
        }
    }

    for (CloneDestination &d : m_cloneDests) {
        if (d.screen != this) {
            d.screen->ensureModeSet(fb->fb);
            d.cloneFlipPending = true;
            const QKmsOutput &destOutput(d.screen->output());

            if (device()->hasAtomicSupport()) {
#if QT_CONFIG(drm_atomic)
                drmModeAtomicReq *request = device()->threadLocalAtomicRequest();
                if (request)
                    addAtomicFlip(request, destOutput, fb->fb);

                // ### This path is broken. On the other branch we can easily
                // pass in d.screen as the user_data for drmModePageFlip, but
                // using one atomic request breaks down here since we get events
                // with the same user_data passed to drmModeAtomicCommit.  Until
                // this gets reworked (multiple requests?) screen cloning is not
                // compatible with atomic.
#endif
            } else {
                int ret = drmModePageFlip(fd,
                                          destOutput.crtc_id,
                                          fb->fb,
                                          DRM_MODE_PAGE_FLIP_EVENT,
                                          d.screen);
                if (ret) {
                    qErrnoWarning("Could not queue DRM page flip for screen %s (clones screen %s)",
                                  qPrintable(d.screen->name()),
                                  qPrintable(name()));
                    d.cloneFlipPending = false;
                }
            }
        }
    }

    if (device()->hasAtomicSupport()) {
#if QT_CONFIG(drm_atomic)
        if (!device()->threadLocalAtomicCommit(this)) {
            return;
        }
#endif
    }

    gbmRelease.dismiss();
}